

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall cmGeneratedFileStreamBase::Open(cmGeneratedFileStreamBase *this,string *name)

{
  string *source;
  undefined1 local_38 [8];
  string dir;
  string *name_local;
  cmGeneratedFileStreamBase *this_local;
  
  dir.field_2._8_8_ = name;
  std::__cxx11::string::operator=((string *)this,(string *)name);
  source = &this->TempName;
  std::__cxx11::string::operator=((string *)source,(string *)dir.field_2._8_8_);
  std::__cxx11::string::operator+=((string *)source,".tmp");
  cmsys::SystemTools::RemoveFile(source);
  cmsys::SystemTools::GetFilenamePath((string *)local_38,source);
  cmsys::SystemTools::MakeDirectory((string *)local_38,(mode_t *)0x0);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmGeneratedFileStreamBase::Open(std::string const& name)
{
  // Save the original name of the file.
  this->Name = name;

  // Create the name of the temporary file.
  this->TempName = name;
#if defined(__VMS)
  this->TempName += "_tmp";
#else
  this->TempName += ".tmp";
#endif

  // Make sure the temporary file that will be used is not present.
  cmSystemTools::RemoveFile(this->TempName);

  std::string dir = cmSystemTools::GetFilenamePath(this->TempName);
  cmSystemTools::MakeDirectory(dir);
}